

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemListView.cpp
# Opt level: O3

void __thiscall
QFileSystemListViewPrivate::activated(QFileSystemListViewPrivate *this,QModelIndex *index)

{
  QFileSystemListView *this_00;
  QFileSystemModel *pQVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  QFileInfo fileInfo;
  undefined1 auStack_38 [32];
  
  if (this->browsable == true) {
    cVar2 = QFileSystemModel::isDir((QModelIndex *)this->model);
    if (cVar2 != '\0') {
      iVar3 = QGuiApplication::keyboardModifiers();
      if (iVar3 == 0) {
        QFileSystemModel::fileInfo((QModelIndex *)auStack_38);
        cVar2 = QFileInfo::isReadable();
        if (cVar2 != '\0') {
          this_00 = this->widget;
          QFileInfo::filePath();
          QFileSystemListView::setRootPath(this_00,(QString *)(auStack_38 + 8));
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)(auStack_38 + 8));
          cVar2 = QFileInfo::isRoot();
          if ((cVar2 == '\0') && (this->browsable != false)) {
            pQVar1 = this->model;
            uVar4 = QFileSystemModel::filter();
            QFileSystemModel::setFilter(pQVar1,uVar4 & 0xffffbfff);
          }
          else {
            pQVar1 = this->model;
            uVar4 = QFileSystemModel::filter();
            QFileSystemModel::setFilter(pQVar1,uVar4 | 0x4000);
          }
        }
        QFileInfo::~QFileInfo((QFileInfo *)auStack_38);
      }
    }
  }
  return;
}

Assistant:

void activated(const QModelIndex &index) {
        if (!browsable || !model->isDir(index) || QApplication::keyboardModifiers() != Qt::NoModifier) {
            return;
        }

        const QFileInfo fileInfo = model->fileInfo(index);
        if (fileInfo.isReadable()) {
            widget->setRootPath(fileInfo.filePath());

            if (fileInfo.isRoot() || !browsable) {
                model->setFilter(model->filter() | QDir::NoDotDot);
            } else {
                model->setFilter(model->filter() & ~QDir::NoDotDot);
            }
        }
    }